

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivMark(Gia_Man_t *p,char *pFileName,int fSkipSome,int fVerbose)

{
  Gia_Rpr_t GVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  Vec_Int_t *vTrace;
  int *piVar4;
  Gia_Man_t *p_01;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint local_3c;
  
  if ((long)p->nObjs < 1) {
    uVar12 = 0;
  }
  else {
    lVar7 = 0;
    uVar12 = 0;
    do {
      uVar12 = (uVar12 + 1) - (uint)((~(uint)p->pReprs[lVar7] & 0xfffffff) == 0);
      lVar7 = lVar7 + 1;
    } while (p->nObjs != lVar7);
  }
  if (uVar12 == 0) {
    Abc_Print(1,"Gia_ManEquivMark(): Current AIG does not have equivalences.\n");
    return;
  }
  p_00 = Gia_AigerRead(pFileName,0,0,0);
  if (p_00 == (Gia_Man_t *)0x0) {
    Abc_Print(1,"Gia_ManEquivMark(): Input file %s could not be read.\n",pFileName);
    return;
  }
  if (fSkipSome == 0) {
    uVar9 = p_00->vCos->nSize - p_00->nRegs;
    uVar3 = p->vCos->nSize - p->nRegs;
    if (uVar9 != uVar3 + uVar12) {
      Abc_Print(1,
                "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGEquivNum(%d).\n"
                ,(ulong)uVar9,(ulong)uVar3,(ulong)uVar12);
      goto LAB_00201580;
    }
    if (p->nObjs < 1) {
      uVar3 = 0;
      local_3c = 0;
    }
    else {
      lVar7 = 0;
      local_3c = 0;
      uVar3 = 0;
      do {
        GVar1 = p->pReprs[lVar7];
        if ((~(uint)GVar1 & 0xfffffff) != 0) {
          uVar9 = (p->vCos->nSize - p->nRegs) + uVar3;
          iVar2 = p_00->vCos->nSize;
          if (iVar2 - p_00->nRegs <= (int)uVar9) goto LAB_002015f3;
          if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) goto LAB_00201596;
          iVar2 = p_00->vCos->pArray[uVar9];
          if (((long)iVar2 < 0) || (p_00->nObjs <= iVar2)) goto LAB_002015b5;
          uVar9 = iVar2 - (*(uint *)(p_00->pObjs + iVar2) & 0x1fffffff);
          if ((int)uVar9 < 0) goto LAB_002015d4;
          uVar3 = uVar3 + 1;
          if ((uVar9 & 0x7fffffff) == 0 && (*(uint *)(p_00->pObjs + iVar2) >> 0x1d & 1) == 0) {
            p->pReprs[lVar7] = (Gia_Rpr_t)((uint)GVar1 | 0x10000000);
            local_3c = local_3c + 1;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < p->nObjs);
    }
    if (uVar3 != uVar12) {
      __assert_fail("nLits == nLitsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x63f,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
    }
  }
  else {
    vTrace = (Vec_Int_t *)malloc(0x10);
    vTrace->nCap = 100;
    vTrace->nSize = 0;
    piVar4 = (int *)malloc(400);
    vTrace->pArray = piVar4;
    uVar9 = 0;
    p_01 = Gia_ManSpecReduceTrace(p,vTrace,(Vec_Int_t *)0x0);
    Gia_ManStop(p_01);
    uVar3 = vTrace->nSize;
    if (uVar3 != uVar12) {
      __assert_fail("Vec_IntSize(vTrace) == nLitsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x607,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
    }
    if (0 < (int)uVar3) {
      uVar8 = 0;
      uVar9 = 0;
      do {
        uVar9 = (uVar9 + 1) - (uint)(vTrace->pArray[uVar8] == 0);
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    uVar10 = p_00->vCos->nSize - p_00->nRegs;
    uVar5 = p->vCos->nSize - p->nRegs;
    uVar3 = uVar5 + uVar9;
    if (uVar10 == uVar3) {
      if (p->nObjs < 1) {
        uVar5 = 0;
        uVar6 = 0;
        local_3c = 0;
      }
      else {
        lVar7 = 0;
        local_3c = 0;
        uVar6 = 0;
        uVar5 = 0;
        do {
          GVar1 = p->pReprs[lVar7];
          if ((~(uint)GVar1 & 0xfffffff) != 0) {
            if (((int)uVar6 < 0) || (vTrace->nSize <= (int)uVar6)) goto LAB_00201596;
            uVar8 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
            if (vTrace->pArray[uVar8] != 0) {
              uVar11 = (p->vCos->nSize - p->nRegs) + uVar5;
              iVar2 = p_00->vCos->nSize;
              if (iVar2 - p_00->nRegs <= (int)uVar11) {
LAB_002015f3:
                __assert_fail("v < Gia_ManPoNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
              }
              if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) {
LAB_00201596:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar2 = p_00->vCos->pArray[uVar11];
              if (((long)iVar2 < 0) || (p_00->nObjs <= iVar2)) {
LAB_002015b5:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              uVar11 = iVar2 - (*(uint *)(p_00->pObjs + iVar2) & 0x1fffffff);
              if ((int)uVar11 < 0) {
LAB_002015d4:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              uVar5 = uVar5 + 1;
              if ((uVar11 & 0x7fffffff) == 0 && (*(uint *)(p_00->pObjs + iVar2) >> 0x1d & 1) == 0) {
                p->pReprs[lVar7] = (Gia_Rpr_t)((uint)GVar1 | 0x10000000);
                local_3c = local_3c + 1;
              }
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < p->nObjs);
      }
      if (uVar6 != uVar12) {
        __assert_fail("nLits == nLitsAll",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x625,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
      }
      if (uVar5 != uVar9) {
        __assert_fail("iLit == nAddPos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x626,"void Gia_ManEquivMark(Gia_Man_t *, char *, int, int)");
      }
      piVar4 = vTrace->pArray;
    }
    else {
      local_3c = 0;
      Abc_Print(1,
                "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGFilteredEquivNum(%d).\n"
                ,(ulong)uVar10,(ulong)uVar5,(ulong)uVar9);
      Gia_ManStop(p_00);
      piVar4 = vTrace->pArray;
    }
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      vTrace->pArray = (int *)0x0;
    }
    free(vTrace);
    if (uVar10 != uVar3) {
      return;
    }
  }
  if (fVerbose != 0) {
    Abc_Print(1,"Set %d equivalences as proved.\n",(ulong)local_3c);
  }
LAB_00201580:
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManEquivMark( Gia_Man_t * p, char * pFileName, int fSkipSome, int fVerbose )
{
    Gia_Man_t * pMiter, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit, nAddPos, nLits = 0;
    int nLitsAll, Counter = 0;
    nLitsAll = Gia_ManEquivCountLitsAll( p );
    if ( nLitsAll == 0 )
    {
        Abc_Print( 1, "Gia_ManEquivMark(): Current AIG does not have equivalences.\n" );
        return;
    }
    // read AIGER file
    pMiter = Gia_AigerRead( pFileName, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        Abc_Print( 1, "Gia_ManEquivMark(): Input file %s could not be read.\n", pFileName );
        return;
    }
    if ( fSkipSome )
    {
        Vec_Int_t * vTrace = Vec_IntAlloc( 100 );
        pTemp = Gia_ManSpecReduceTrace( p, vTrace, NULL );
        Gia_ManStop( pTemp );
        assert( Vec_IntSize(vTrace) == nLitsAll );
        // count the number of non-zero entries
        nAddPos = 0;
        Vec_IntForEachEntry( vTrace, iLit, i )
            if ( iLit )
                nAddPos++;
        // check the number
        if ( Gia_ManPoNum(pMiter) != Gia_ManPoNum(p) + nAddPos )
        {
            Abc_Print( 1, "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGFilteredEquivNum(%d).\n",
                Gia_ManPoNum(pMiter), Gia_ManPoNum(p), nAddPos );
            Gia_ManStop( pMiter );
            Vec_IntFreeP( &vTrace );
            return;
        }
        // mark corresponding POs as solved
        nLits = iLit = Counter = 0;
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
        {
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                continue;
            if ( Vec_IntEntry( vTrace, nLits++ ) == 0 )
                continue;
            pObj = Gia_ManPo( pMiter, Gia_ManPoNum(p) + iLit++ );
            if ( Gia_ObjFaninLit0p(pMiter, pObj) == 0 ) // const 0 - proven
            {
                Gia_ObjSetProved(p, i);
                Counter++;
            }
        }
        assert( nLits == nLitsAll );
        assert( iLit == nAddPos );
        Vec_IntFreeP( &vTrace );
    }
    else
    {
        if ( Gia_ManPoNum(pMiter) != Gia_ManPoNum(p) + nLitsAll )
        {
            Abc_Print( 1, "Gia_ManEquivMark(): The number of POs is not correct: MiterPONum(%d) != AIGPONum(%d) + AIGEquivNum(%d).\n",
                Gia_ManPoNum(pMiter), Gia_ManPoNum(p), nLitsAll );
            Gia_ManStop( pMiter );
            return;
        }
        // mark corresponding POs as solved
        nLits = 0;
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
        {
            if ( Gia_ObjRepr(p, i) == GIA_VOID )
                continue;
            pObj = Gia_ManPo( pMiter, Gia_ManPoNum(p) + nLits++ );
            if ( Gia_ObjFaninLit0p(pMiter, pObj) == 0 ) // const 0 - proven
            {
                Gia_ObjSetProved(p, i);
                Counter++;
            }
        }
        assert( nLits == nLitsAll );
    }
    if ( fVerbose )
        Abc_Print( 1, "Set %d equivalences as proved.\n", Counter );
    Gia_ManStop( pMiter );
}